

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall backend::codegen::RegAllocator::perform_load_stores(RegAllocator *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  void *__s;
  long lVar5;
  type pIVar6;
  pair<unsigned_int,_unsigned_int> *ppVar7;
  int *piVar8;
  pointer ppVar9;
  ulong uVar10;
  long *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar11;
  ReplaceWriteAction RVar12;
  int in_stack_0000001c;
  Reg *in_stack_00000020;
  RegAllocator *in_stack_00000028;
  optional<unsigned_int> in_stack_00000034;
  int in_stack_000001cc;
  Reg *in_stack_000001d0;
  RegAllocator *in_stack_000001d8;
  _Optional_payload_base<unsigned_int> in_stack_000001e0;
  type_conflict1 *rd_1;
  type_conflict1 *r_2;
  int offset;
  CtrlInst *x_8;
  iterator it;
  int i_2;
  int i_1;
  int reg_cnt;
  int param_cnt;
  Label *label;
  type_conflict1 *rd;
  type_conflict1 *r_1;
  BrInst *x_7;
  LabelInst *x_6;
  PushPopInst *x_5;
  MultLoadStoreInst *x_4;
  ReplaceWriteAction prw_4;
  add_pointer_t<arm::MemoryOperand> mem;
  LoadStoreInst *x_3;
  ReplaceWriteAction prw_3;
  Reg r;
  ReplaceWriteAction prw_2;
  Arith2Inst *x_2;
  ReplaceWriteAction prw_1;
  Arith4Inst *x_1;
  ReplaceWriteAction prw;
  Arith3Inst *x;
  Inst *inst_;
  int i;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffff8f8;
  Function *in_stack_fffffffffffff900;
  const_iterator in_stack_fffffffffffff908;
  Function *in_stack_fffffffffffff910;
  Function *in_stack_fffffffffffff928;
  ostream *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff938;
  uint in_stack_fffffffffffff93c;
  RegAllocator *in_stack_fffffffffffff940;
  long local_6a0;
  long local_688;
  Timestamp *in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  long local_668;
  long local_650;
  long local_638;
  undefined4 in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  ostream *in_stack_fffffffffffffa00;
  long local_5f8;
  long local_5a0;
  long local_548;
  long local_510;
  bool also_erase_map;
  Reg r_00;
  RegAllocator *in_stack_fffffffffffffb60;
  _List_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_448;
  _List_node_base *local_440;
  _Node_iterator_base<unsigned_int,_false> local_438;
  _Node_iterator_base<unsigned_int,_false> local_430;
  _Node_iterator_base<unsigned_int,_false> local_428;
  _Node_iterator_base<unsigned_int,_false> local_420;
  _Self local_418;
  _Self local_410;
  undefined4 local_408;
  undefined4 local_404;
  undefined4 local_400;
  undefined4 local_3fc;
  undefined4 local_3f8;
  undefined4 local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  long local_3d8;
  undefined8 local_3c4;
  undefined4 local_3bc;
  type_conflict1 local_3b4;
  type_conflict1 tStack_3b0;
  undefined4 local_3ac;
  type_conflict1 *local_3a8;
  type_conflict1 *local_3a0;
  pair<unsigned_int,_unsigned_int> local_398;
  long local_390;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_388;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_380;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_378;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_370;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_368;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_360;
  long local_358;
  long local_350;
  long local_348;
  undefined8 local_334;
  ReplaceWriteKind local_32c;
  undefined8 local_324;
  ReplaceWriteKind local_31c;
  ReplaceWriteAction local_318;
  undefined8 local_2fc;
  ReplaceWriteKind local_2f4;
  _Node_iterator_base<unsigned_int,_false> local_2f0;
  undefined1 local_2e8;
  int in_stack_fffffffffffffd1c;
  RegAllocator *in_stack_fffffffffffffd20;
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [68];
  int in_stack_ffffffffffffff4c;
  RegAllocator *in_stack_ffffffffffffff50;
  ReplaceWriteAction in_stack_ffffffffffffff6c;
  time_point_sys_clock local_80;
  Timestamp local_78 [3];
  undefined1 local_19;
  type local_18;
  int local_c;
  
  local_c = 0;
  do {
    uVar10 = (ulong)local_c;
    sVar3 = std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    *)(*in_RDI + 0x28));
    if (sVar3 <= uVar10) {
      return;
    }
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  *)(*in_RDI + 0x28),(long)local_c);
    local_18 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                         ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                          in_stack_fffffffffffff900);
    local_19 = 0;
    AixLog::operator<<(in_stack_fffffffffffffa00,
                       (Severity *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    AixLog::Tag::Tag((Tag *)0x2399f7);
    AixLog::operator<<(in_stack_fffffffffffff930,(Tag *)in_stack_fffffffffffff928);
    local_80.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_78,&local_80);
    AixLog::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                       in_stack_fffffffffffff988);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940,
               (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (allocator<char> *)in_stack_fffffffffffff930);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff940,
               (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (allocator<char> *)in_stack_fffffffffffff930);
    AixLog::Function::Function
              (in_stack_fffffffffffff910,(string *)in_stack_fffffffffffff908._M_node,
               (string *)in_stack_fffffffffffff900,(size_t)in_stack_fffffffffffff8f8);
    poVar4 = AixLog::operator<<(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    poVar4 = std::operator<<(poVar4," ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = prelude::operator<<((ostream *)in_stack_fffffffffffff900,
                                 (Displayable *)in_stack_fffffffffffff8f8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff900);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    AixLog::Timestamp::~Timestamp(local_78);
    AixLog::Tag::~Tag((Tag *)0x239bce);
    *(ConditionCode *)((long)in_RDI + 0x3ee) = local_18->cond;
    if (local_18 == (type)0x0) {
      local_510 = 0;
    }
    else {
      local_510 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::Arith3Inst::typeinfo,0);
    }
    if (local_510 == 0) {
      if (local_18 == (type)0x0) {
        local_548 = 0;
      }
      else {
        local_548 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::Arith4Inst::typeinfo,0);
      }
      if (local_548 == 0) {
        if (local_18 == (type)0x0) {
          local_5a0 = 0;
        }
        else {
          local_5a0 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::Arith2Inst::typeinfo,0);
        }
        if (local_5a0 == 0) {
          if (local_18 == (type)0x0) {
            local_5f8 = 0;
          }
          else {
            local_5f8 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::LoadStoreInst::typeinfo,0
                                      );
          }
          if (local_5f8 == 0) {
            if (local_18 == (type)0x0) {
              local_638 = 0;
            }
            else {
              local_638 = __dynamic_cast(local_18,&arm::Inst::typeinfo,
                                         &arm::MultLoadStoreInst::typeinfo,0);
            }
            local_348 = local_638;
            if (local_638 != 0) {
              __s = (void *)__cxa_allocate_exception(8);
              memset(__s,0,8);
              prelude::NotImplementedException::NotImplementedException
                        ((NotImplementedException *)in_stack_fffffffffffff900);
              __cxa_throw(__s,&prelude::NotImplementedException::typeinfo,
                          prelude::NotImplementedException::~NotImplementedException);
            }
            if (local_18 == (type)0x0) {
              local_650 = 0;
            }
            else {
              local_650 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::PushPopInst::typeinfo,0
                                        );
            }
            local_350 = local_650;
            if (local_650 == 0) {
              if (local_18 == (type)0x0) {
                local_668 = 0;
              }
              else {
                local_668 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::LabelInst::typeinfo,0
                                          );
              }
              local_358 = local_668;
              if (local_668 == 0) {
                if (local_18 == (type)0x0) {
                  local_6a0 = 0;
                }
                else {
                  local_6a0 = __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::BrInst::typeinfo,0)
                  ;
                }
                local_390 = local_6a0;
                if (local_6a0 == 0) {
                  if (local_18 == (type)0x0) {
                    in_stack_fffffffffffff910 = (Function *)0x0;
                  }
                  else {
                    in_stack_fffffffffffff910 =
                         (Function *)
                         __dynamic_cast(local_18,&arm::Inst::typeinfo,&arm::CtrlInst::typeinfo,0);
                  }
                  if (in_stack_fffffffffffff910 == (Function *)0x0) {
                    invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
                    in_stack_fffffffffffff900 = (Function *)(in_RDI + 0x65);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                  *)(*in_RDI + 0x28),(long)local_c);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                 *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8
                               );
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffff900,
                                            (char *)in_stack_fffffffffffff8f8);
                    if (bVar1) {
                      iVar2 = std::any_cast<int>((any *)in_stack_fffffffffffff900);
                      *(int *)((long)in_RDI + 0x3dc) = iVar2 + *(int *)((long)in_RDI + 0x3dc);
                    }
                    invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
                    in_stack_fffffffffffff908._M_node = (_List_node_base *)(in_RDI + 0x65);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                  *)(*in_RDI + 0x28),(long)local_c);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                 *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8
                               );
                  }
                }
                else {
                  bVar1 = std::optional::operator_cast_to_bool
                                    ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x23add9);
                  if (bVar1) {
                    ppVar7 = std::optional<std::pair<unsigned_int,_unsigned_int>_>::value
                                       ((optional<std::pair<unsigned_int,_unsigned_int>_> *)
                                        in_stack_fffffffffffff900);
                    local_398 = *ppVar7;
                    local_3a0 = std::get<0ul,unsigned_int,unsigned_int>
                                          ((pair<unsigned_int,_unsigned_int> *)0x23ae0e);
                    local_3a8 = std::get<1ul,unsigned_int,unsigned_int>
                                          ((pair<unsigned_int,_unsigned_int> *)0x23ae23);
                    local_3b4 = *local_3a0;
                    tStack_3b0 = *local_3a8;
                    local_3ac = 2;
                    local_3c4 = CONCAT44(tStack_3b0,local_3b4);
                    local_3bc = 2;
                    replace_write(in_stack_ffffffffffffff50,in_stack_ffffffffffffff6c,
                                  in_stack_ffffffffffffff4c);
                    std::optional<std::pair<unsigned_int,_unsigned_int>_>::optional
                              ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x23aea6);
                    std::optional<std::pair<unsigned_int,_unsigned_int>_>::operator=
                              ((optional<std::pair<unsigned_int,_unsigned_int>_> *)
                               in_stack_fffffffffffff900,
                               (optional<std::pair<unsigned_int,_unsigned_int>_> *)
                               in_stack_fffffffffffff8f8);
                  }
                  invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
                  if (*(int *)(local_390 + 8) == 2) {
                    *(undefined1 *)((long)in_RDI + 0x3ed) = 0;
                    local_3d8 = local_390 + 0x10;
                    local_3dc = *(int *)(local_390 + 0x30);
                    local_3e4 = 4;
                    piVar8 = std::min<int>(&local_3dc,&local_3e4);
                    local_3e0 = *piVar8;
                    for (local_3e8 = 0; local_3e8 < local_3e0; local_3e8 = local_3e8 + 1) {
                      local_3ec = local_3e8;
                      std::
                      unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                      ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                               *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8);
                    }
                    local_3f0 = local_3e0;
                    while( true ) {
                      bVar1 = SUB81((ulong)in_RDI >> 0x10,0);
                      also_erase_map = SUB81((ulong)in_RDI >> 0x18,0);
                      r_00 = (Reg)((ulong)in_RDI >> 0x20);
                      if (3 < local_3f0) break;
                      force_free(in_stack_fffffffffffffb60,r_00,also_erase_map,bVar1);
                      local_3f0 = local_3f0 + 1;
                    }
                    force_free(in_stack_fffffffffffffb60,r_00,also_erase_map,bVar1);
                    force_free(in_stack_fffffffffffffb60,(Reg)((ulong)in_RDI >> 0x20),
                               SUB81((ulong)in_RDI >> 0x18,0),SUB81((ulong)in_RDI >> 0x10,0));
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                  *)(*in_RDI + 0x28),(long)local_c);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                 *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8
                               );
                    local_3f4 = 0;
                    std::
                    unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                    ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                             *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8);
                    local_3f8 = 1;
                    std::
                    unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                    ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                             *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8);
                    local_3fc = 2;
                    std::
                    unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                    ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                             *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8);
                    local_400 = 3;
                    std::
                    unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                    ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                             *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8);
                    local_404 = 0xc;
                    std::
                    unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                    ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                             *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8);
                    local_408 = 0xe;
                    std::
                    unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                    ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                             *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8);
                  }
                  else if (*(int *)(local_390 + 8) == 1) {
                    if ((*(byte *)((long)in_RDI + 0x3ec) & 1) != 0) {
                      local_410._M_node =
                           (_List_node_base *)
                           std::__cxx11::
                           list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ::begin((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    *)in_stack_fffffffffffff8f8);
                      while( true ) {
                        local_418._M_node =
                             (_List_node_base *)
                             std::__cxx11::
                             list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             ::end((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    *)in_stack_fffffffffffff8f8);
                        bVar1 = std::operator!=(&local_410,&local_418);
                        if (!bVar1) break;
                        std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                                  ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)
                                   0x23b1da);
                        local_420._M_cur =
                             (__node_type *)
                             std::
                             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             ::find(in_stack_fffffffffffff8f8,(key_type *)0x23b1e7);
                        local_428._M_cur =
                             (__node_type *)
                             std::
                             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             ::end(in_stack_fffffffffffff8f8);
                        bVar1 = std::__detail::operator!=(&local_420,&local_428);
                        if (bVar1) {
                          ppVar9 = std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::
                                   operator->((_List_iterator<std::pair<unsigned_int,_unsigned_int>_>
                                               *)0x23b236);
                          in_stack_fffffffffffff93c = ppVar9->second;
                          in_stack_fffffffffffff930 = (ostream *)(in_RDI + 0x6e);
                          std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                                    ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)
                                     0x23b260);
                          local_430._M_cur =
                               (__node_type *)
                               std::
                               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               ::find(in_stack_fffffffffffff8f8,(key_type *)0x23b26d);
                          local_438._M_cur =
                               (__node_type *)
                               std::
                               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               ::end(in_stack_fffffffffffff8f8);
                          std::__detail::operator!=(&local_430,&local_438);
                          force_free(in_stack_fffffffffffffb60,(Reg)((ulong)in_RDI >> 0x20),
                                     SUB81((ulong)in_RDI >> 0x18,0),SUB81((ulong)in_RDI >> 0x10,0));
                          in_stack_fffffffffffff940 = (RegAllocator *)(in_RDI + 0x31);
                          std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator->
                                    ((_List_iterator<std::pair<unsigned_int,_unsigned_int>_> *)
                                     0x23b2e1);
                          std::
                          unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                          ::erase((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                                   *)in_stack_fffffffffffff900,(key_type *)in_stack_fffffffffffff8f8
                                 );
                          std::_List_const_iterator<std::pair<unsigned_int,_unsigned_int>_>::
                          _List_const_iterator(&local_448,&local_410);
                          local_440 = (_List_node_base *)
                                      std::__cxx11::
                                      list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ::erase((list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                               *)in_stack_fffffffffffff900,in_stack_fffffffffffff908
                                             );
                          local_410._M_node = local_440;
                        }
                        else {
                          std::_List_iterator<std::pair<unsigned_int,_unsigned_int>_>::operator++
                                    (&local_410,0);
                        }
                      }
                      std::
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)0x23b376);
                      *(undefined1 *)((long)in_RDI + 0x3ec) = 0;
                    }
                    in_stack_fffffffffffff928 = (Function *)(in_RDI + 0x65);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                  *)(*in_RDI + 0x28),(long)local_c);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                 *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8
                               );
                  }
                  else {
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                  *)(*in_RDI + 0x28),(long)local_c);
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                 *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8
                               );
                  }
                }
              }
              else {
                invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
                in_stack_fffffffffffff988 = (Timestamp *)(in_RDI + 0x65);
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                              *)(*in_RDI + 0x28),(long)local_c);
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                             *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
                lVar5 = std::__cxx11::string::find((char *)(local_358 + 0x10),0x2ccdbd);
                in_stack_fffffffffffff997 = false;
                if (lVar5 == 0) {
                  sVar3 = std::
                          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                          ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                  *)(in_RDI + 0x65));
                  in_stack_fffffffffffff997 = false;
                  if (1 < sVar3) {
                    local_368 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                                std::
                                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                       *)in_stack_fffffffffffff8f8);
                    local_360 = __gnu_cxx::
                                __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                             *)in_stack_fffffffffffff908._M_node,
                                            (difference_type)in_stack_fffffffffffff900);
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                    ::operator*(&local_360);
                    pIVar6 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                                       ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                                        in_stack_fffffffffffff900);
                    if (pIVar6 == (type)0x0) {
                      local_688 = 0;
                    }
                    else {
                      local_688 = __dynamic_cast(pIVar6,&arm::Inst::typeinfo,
                                                 &arm::LoadStoreInst::typeinfo,0);
                    }
                    in_stack_fffffffffffff997 = local_688 != 0;
                  }
                }
                if ((bool)in_stack_fffffffffffff997 != false) {
                  local_378 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                              std::
                              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                              ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                     *)in_stack_fffffffffffff8f8);
                  local_370 = __gnu_cxx::
                              __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                              ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                           *)in_stack_fffffffffffff908._M_node,
                                          (difference_type)in_stack_fffffffffffff900);
                  __gnu_cxx::
                  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                  ::operator*(&local_370);
                  local_388 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                              std::
                              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                              ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                     *)in_stack_fffffffffffff8f8);
                  local_380 = __gnu_cxx::
                              __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                              ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                           *)in_stack_fffffffffffff908._M_node,
                                          (difference_type)in_stack_fffffffffffff900);
                  __gnu_cxx::
                  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                  ::operator*(&local_380);
                  std::swap<arm::Inst,std::default_delete<arm::Inst>>
                            ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                             in_stack_fffffffffffff900,
                             (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                             in_stack_fffffffffffff8f8);
                }
                lVar5 = std::__cxx11::string::find((char)local_358 + '\x10',0);
                if (lVar5 != 0) {
                  *(undefined1 *)((long)in_RDI + 0x3ec) = 1;
                }
              }
            }
            else {
              invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                            *)(*in_RDI + 0x28),(long)local_c);
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                           *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
            }
          }
          else {
            in_stack_fffffffffffffd20 =
                 (RegAllocator *)
                 std::get_if<arm::MemoryOperand,std::__cxx11::string,arm::MemoryOperand>
                           ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                             *)0x23a716);
            if (in_stack_fffffffffffffd20 != (RegAllocator *)0x0) {
              replace_read(in_stack_fffffffffffff940,
                           (MemoryOperand *)
                           CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                           (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
            }
            if (*(int *)(local_5f8 + 8) == 0x1a) {
              invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
              pVar11 = std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)in_stack_fffffffffffff910,
                                (value_type *)in_stack_fffffffffffff908._M_node);
              local_2f0._M_cur =
                   (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur
              ;
              local_2e8 = pVar11.second;
              in_stack_fffffffffffff9fc = local_c;
              std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a7c9);
              RVar12 = pre_replace_write(in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                                         in_stack_00000034);
              local_318._0_8_ = RVar12._0_8_;
              local_2fc._0_4_ = local_318.from;
              local_2fc._4_4_ = local_318.replace_with;
              local_318.kind = RVar12.kind;
              local_2f4 = local_318.kind;
              in_stack_fffffffffffffa00 = (ostream *)(in_RDI + 0x65);
              local_318 = RVar12;
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                            *)(*in_RDI + 0x28),(long)local_c);
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                           *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
              local_324 = local_2fc;
              local_31c = local_2f4;
              local_334 = local_2fc;
              local_32c = local_2f4;
              replace_write(in_stack_ffffffffffffff50,in_stack_ffffffffffffff6c,
                            in_stack_ffffffffffffff4c);
            }
            else {
              std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a8ee);
              replace_read(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                           (optional<unsigned_int>)in_stack_000001e0);
              invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                            *)(*in_RDI + 0x28),(long)local_c);
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                           *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
            }
          }
        }
        else if ((*(int *)(local_5a0 + 8) == 6) || (*(int *)(local_5a0 + 8) == 8)) {
          replace_read(in_stack_fffffffffffff940,
                       (Operand2 *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                       (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
          invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908._M_node);
          std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a302);
          pre_replace_write(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000034)
          ;
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)(*in_RDI + 0x28),(long)local_c);
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
          replace_write(in_stack_ffffffffffffff50,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff4c);
        }
        else if (*(int *)(local_5a0 + 8) == 7) {
          std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a44b);
          replace_read(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                       (optional<unsigned_int>)in_stack_000001e0);
          invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908._M_node);
          std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                    ((optional<unsigned_int> *)in_stack_fffffffffffff900,
                     (uint *)in_stack_fffffffffffff8f8);
          pre_replace_write(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000034)
          ;
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)(*in_RDI + 0x28),(long)local_c);
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
          replace_write(in_stack_ffffffffffffff50,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff4c);
        }
        else {
          std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a5fe);
          replace_read(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                       (optional<unsigned_int>)in_stack_000001e0);
          replace_read(in_stack_fffffffffffff940,
                       (Operand2 *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                       (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
          invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)(*in_RDI + 0x28),(long)local_c);
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
        }
      }
      else {
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x239fb4);
        replace_read(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                     (optional<unsigned_int>)in_stack_000001e0);
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a007);
        replace_read(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                     (optional<unsigned_int>)in_stack_000001e0);
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a05a);
        replace_read(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                     (optional<unsigned_int>)in_stack_000001e0);
        invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908._M_node);
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x23a0f0);
        pre_replace_write(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000034);
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      *)(*in_RDI + 0x28),(long)local_c);
        std::
        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
        ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                     *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
        replace_write(in_stack_ffffffffffffff50,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff4c)
        ;
      }
    }
    else {
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x239d6f);
      replace_read(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                   (optional<unsigned_int>)in_stack_000001e0);
      replace_read(in_stack_fffffffffffff940,
                   (Operand2 *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                   (int)((ulong)in_stack_fffffffffffff930 >> 0x20));
      invalidate_read(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908._M_node);
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)0x239e25);
      pre_replace_write(in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000034);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::operator[]((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    *)(*in_RDI + 0x28),(long)local_c);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
      replace_write(in_stack_ffffffffffffff50,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff4c);
    }
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x23b56a);
    if (bVar1) {
      std::optional<std::pair<unsigned_int,_unsigned_int>_>::value
                ((optional<std::pair<unsigned_int,_unsigned_int>_> *)in_stack_fffffffffffff900);
      std::get<0ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x23b59f);
      std::get<1ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x23b5b4);
      replace_write(in_stack_ffffffffffffff50,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff4c);
      std::optional<std::pair<unsigned_int,_unsigned_int>_>::optional
                ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x23b637);
      std::optional<std::pair<unsigned_int,_unsigned_int>_>::operator=
                ((optional<std::pair<unsigned_int,_unsigned_int>_> *)in_stack_fffffffffffff900,
                 (optional<std::pair<unsigned_int,_unsigned_int>_> *)in_stack_fffffffffffff8f8);
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void RegAllocator::perform_load_stores() {
  for (int i = 0; i < f.inst.size(); i++) {
    auto inst_ = &*f.inst[i];
    LOG(TRACE) << " " << std::endl << *inst_ << std::endl;
    cur_cond = inst_->cond;
    if (auto x = dynamic_cast<Arith3Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith4Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      replace_read(x->r3, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
      if (x->op == arm::OpCode::Mov || x->op == arm::OpCode::Mvn) {
        replace_read(x->r2, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(x->r1, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else if (x->op == arm::OpCode::MovT) {
        auto r = x->r1;
        replace_read(x->r1, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(r, i, x->r1);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        replace_read(x->r1, i);
        replace_read(x->r2, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_)) {
      if (auto mem = std::get_if<MemoryOperand>(&x->mem)) {
        replace_read(*mem, i);
      }
      if (x->op == arm::OpCode::LdR) {
        invalidate_read(i);
        wrote_to.insert(x->rd);
        auto prw = pre_replace_write(x->rd, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        // StR
        replace_read(x->rd, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<MultLoadStoreInst *>(inst_)) {
      throw prelude::NotImplementedException();
      if (x->op == arm::OpCode::LdM) {
        for (auto rd : x->rd) add_reg_write(rd, i);
      } else {
        // StM
        for (auto rd : x->rd) add_reg_read(rd, i);
      }
      invalidate_read(i);
      add_reg_read(x->rn, i);
    } else if (auto x = dynamic_cast<PushPopInst *>(inst_)) {
      // push pop only use gpr
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else if (auto x = dynamic_cast<LabelInst *>(inst_)) {
      invalidate_read(i);

      inst_sink.push_back(std::move(f.inst[i]));
      if (x->label.find(".ld_pc") == 0 && inst_sink.size() >= 2 &&
          dynamic_cast<LoadStoreInst *>(&**(inst_sink.end() - 2))) {
        // HACK: If it's load_pc label, delay store once more
        std::swap(*(inst_sink.end() - 2), *(inst_sink.end() - 1));
      }
      if (x->label.find(".bb" == 0)) {
        bb_reset = true;
      }
    } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
      if (delayed_store) {
        // TODO: check if this is right
        auto [r, rd] = delayed_store.value();
        replace_write({r, rd, ReplaceWriteKind::Spill}, i);
        delayed_store = {};
      }
      invalidate_read(i);
      if (x->op == arm::OpCode::Bl) {
        is_leaf_func = false;
        auto &label = x->l;
        int param_cnt = x->param_cnt;
        int reg_cnt = std::min(param_cnt, 4);
        for (int i = 0; i < reg_cnt; i++) active.erase(Reg(i));
        for (int i = reg_cnt; i < 4; i++) force_free(Reg(i));
        // R12 should be freed whatever condition
        force_free(Reg(12));
        force_free(Reg(REG_LR));
        inst_sink.push_back(std::move(f.inst[i]));
        active.erase(Reg(0));
        active.erase(Reg(1));
        active.erase(Reg(2));
        active.erase(Reg(3));
        active.erase(Reg(12));
        active.erase(Reg(REG_LR));
      } else if (x->op == arm::OpCode::B) {
        if (bb_reset) {
          auto it = active_reg_map.begin();

          while (it != active_reg_map.end()) {
            if (spilled_cross_block_reg.find(it->first) !=
                spilled_cross_block_reg.end()) {
              force_free(it->second, false,
                         wrote_to.find(it->first) != wrote_to.end());
              active.erase(it->second);
              it = active_reg_map.erase(it);
            } else {
              it++;
            }
          }
          wrote_to.clear();
          bb_reset = false;
        }
        inst_sink.push_back(std::move(f.inst[i]));
      } else {
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<CtrlInst *>(inst_)) {
      if (x->key == "offset_stack") {
        int offset = std::any_cast<int>(x->val);
        stack_offset += offset;
      }
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else {
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    }
    if (delayed_store) {
      // TODO: check if this is right
      auto [r, rd] = delayed_store.value();
      replace_write({r, rd, ReplaceWriteKind::Spill}, i);
      delayed_store = {};
    }
  }
}